

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeClose(sqlite3_vtab_cursor *cur)

{
  sqlite3_stmt *in_RDI;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  Rtree *pRtree_00;
  
  pRtree_00 = *(Rtree **)in_RDI;
  resetCursor((RtreeCursor *)cur);
  sqlite3_finalize(in_RDI);
  sqlite3_free((void *)0x297a02);
  pRtree_00->nCursor = pRtree_00->nCursor - 1;
  if ((pRtree_00->nCursor == 0) && (pRtree_00->inWrTrans == '\0')) {
    nodeBlobReset(pRtree_00);
  }
  return 0;
}

Assistant:

static int rtreeClose(sqlite3_vtab_cursor *cur){
  Rtree *pRtree = (Rtree *)(cur->pVtab);
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  assert( pRtree->nCursor>0 );
  resetCursor(pCsr);
  sqlite3_finalize(pCsr->pReadAux);
  sqlite3_free(pCsr);
  pRtree->nCursor--;
  if( pRtree->nCursor==0 && pRtree->inWrTrans==0 ){
    nodeBlobReset(pRtree);
  }
  return SQLITE_OK;
}